

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_matlab.cc
# Opt level: O3

void lf::io::writeMatlab(Mesh *mesh,string *filename)

{
  pointer pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char cVar4;
  int iVar5;
  uint uVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  long *plVar8;
  Scalar *pSVar9;
  undefined4 extraout_var_00;
  undefined8 *puVar10;
  undefined4 extraout_var_01;
  runtime_error *prVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  double __tmp;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  MatrixXd zero;
  stringstream ss;
  ofstream file;
  string local_450;
  long local_430;
  string local_428;
  string local_408;
  ulong local_3e8;
  long local_3e0;
  Matrix<double,__1,__1,_0,__1,__1> local_3d8;
  assign_op<double,_double> local_3b8;
  undefined7 uStack_3b7;
  ostream local_3a8 [376];
  undefined1 local_230 [8];
  variable_if_dynamic<long,__1> local_228;
  scalar_constant_op<double> local_220;
  ios_base local_138 [264];
  
  local_230 = (undefined1  [8])0x0;
  local_228.m_value = 1;
  local_220.m_other = 0.0;
  local_3d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_3d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  local_3d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  Eigen::internal::
  resize_if_allowed<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,double,double>
            (&local_3d8,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)local_230,&local_3b8);
  auVar3 = _DAT_0023b720;
  auVar2 = _DAT_0023b710;
  if (0 < local_3d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows * local_3d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                   m_storage.m_cols) {
    uVar12 = local_3d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows * local_3d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols + 0x1fffffffffffffff;
    uVar13 = uVar12 & 0x1fffffffffffffff;
    auVar15._8_4_ = (int)uVar13;
    auVar15._0_8_ = uVar13;
    auVar15._12_4_ = (int)(uVar13 >> 0x20);
    lVar14 = 0;
    auVar15 = auVar15 ^ _DAT_0023b720;
    do {
      auVar16._8_4_ = (int)lVar14;
      auVar16._0_8_ = lVar14;
      auVar16._12_4_ = (int)((ulong)lVar14 >> 0x20);
      auVar16 = (auVar16 | auVar2) ^ auVar3;
      if ((bool)(~(auVar16._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar16._0_4_ ||
                  auVar15._4_4_ < auVar16._4_4_) & 1)) {
        local_3d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        [lVar14] = local_220.m_other;
      }
      if ((auVar16._12_4_ != auVar15._12_4_ || auVar16._8_4_ <= auVar15._8_4_) &&
          auVar16._12_4_ <= auVar15._12_4_) {
        local_3d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        [lVar14 + 1] = local_220.m_other;
      }
      lVar14 = lVar14 + 2;
    } while ((uVar13 - ((uint)uVar12 & 1)) + 2 != lVar14);
  }
  uVar12 = filename->_M_string_length;
  if (((1 < uVar12) && (pcVar1 = (filename->_M_dataplus)._M_p, pcVar1[uVar12 - 2] != '.')) &&
     (pcVar1[uVar12 - 1] != 'm')) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (filename,".m");
  }
  std::ofstream::ofstream(local_230,(string *)filename,_S_out);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 != '\0') {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (filename);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (filename);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,"function [x,y,TRI,QUAD,EDS] = ",0x1e);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_230,(filename->_M_dataplus)._M_p,filename->_M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()",2);
    local_3b8 = (assign_op<double,_double>)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_3b8,1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,"% Data for an unstructure planar hybrid 2D mesh",0x2f);
    local_3b8 = (assign_op<double,_double>)0xa;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,(char *)&local_3b8,1);
    iVar5 = (**mesh->_vptr_Mesh)(mesh);
    if (iVar5 != 2) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_3b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_3a8,"write_matlab() only avvailable for 2D meshes",0x2c);
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"dim_mesh == 2","");
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_428,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/write_matlab.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      lf::base::AssertionFailed(&local_450,&local_428,0x23,&local_408);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,"this code should not be reached");
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar6 = (*mesh->_vptr_Mesh[3])(mesh,2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"x = zeros(",10);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,",1);",4);
    local_3b8 = (assign_op<double,_double>)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_3b8,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"y = zeros(",10);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,",1);",4);
    local_3b8 = (assign_op<double,_double>)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_3b8,1);
    iVar5 = (*mesh->_vptr_Mesh[2])(mesh,2);
    local_430 = CONCAT44(extraout_var,iVar5);
    local_3e8 = (ulong)uVar6;
    if (extraout_RDX == 0) {
      uVar12 = 0;
    }
    else {
      lVar14 = extraout_RDX << 3;
      uVar12 = 0;
      do {
        plVar8 = *(long **)(local_430 + uVar12 * 8);
        (*mesh->_vptr_Mesh[5])(mesh,plVar8);
        plVar8 = (long *)(**(code **)(*plVar8 + 0x18))(plVar8);
        (**(code **)(*plVar8 + 0x18))(&local_3b8,plVar8,&local_3d8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"x(",2);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,") = ",4);
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                            &local_3b8,0,0);
        poVar7 = std::ostream::_M_insert<double>(*pSVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"; ",2);
        local_450._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_450,1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"y(",2);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,") = ",4);
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                            &local_3b8,1,0);
        poVar7 = std::ostream::_M_insert<double>(*pSVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"; ",2);
        local_450._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_450,1);
        uVar12 = uVar12 + 1;
        free((void *)CONCAT71(uStack_3b7,local_3b8));
        lVar14 = lVar14 + -8;
      } while (lVar14 != 0);
    }
    if (uVar12 != local_3e8) {
      std::__cxx11::stringstream::stringstream((stringstream *)&local_3b8);
      std::__ostream_insert<char,std::char_traits<char>>(local_3a8,"Node count mismatch",0x13);
      local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_450,"node_cnt == no_of_nodes","");
      local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_428,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/write_matlab.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      lf::base::AssertionFailed(&local_450,&local_428,0x38,&local_408);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_408._M_dataplus._M_p != &local_408.field_2) {
        operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_428._M_dataplus._M_p != &local_428.field_2) {
        operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != &local_450.field_2) {
        operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
      }
      prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar11,"this code should not be reached");
      __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    (*mesh->_vptr_Mesh[3])(mesh,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"EDS = zeros(",0xc);
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,",2);",4);
    local_3b8 = (assign_op<double,_double>)0xa;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_3b8,1);
    iVar5 = (*mesh->_vptr_Mesh[2])(mesh,1);
    local_430 = CONCAT44(extraout_var_00,iVar5);
    if (extraout_RDX_00 != 0) {
      lVar14 = 0;
      do {
        plVar8 = *(long **)(local_430 + lVar14);
        (*mesh->_vptr_Mesh[5])(mesh,plVar8);
        cVar4 = (**(code **)(*plVar8 + 0x20))(plVar8);
        if (cVar4 != '\x02') {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_3b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_3a8,"Edge must be a segment",0x16);
          local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_450,"ref_el == lf::base::RefEl::kSegment()","");
          local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_428,
                     "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/write_matlab.cc"
                     ,"");
          std::__cxx11::stringbuf::str();
          lf::base::AssertionFailed(&local_450,&local_428,0x42,&local_408);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_408._M_dataplus._M_p != &local_408.field_2) {
            operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_428._M_dataplus._M_p != &local_428.field_2) {
            operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_450._M_dataplus._M_p != &local_450.field_2) {
            operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
          }
          prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar11,"this code should not be reached");
          __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        puVar10 = (undefined8 *)(**(code **)(*plVar8 + 8))(plVar8,1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"EDS(",4);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",:) = [",7);
        (*mesh->_vptr_Mesh[5])(mesh,*puVar10);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
        (*mesh->_vptr_Mesh[5])(mesh,puVar10[1]);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"];",2);
        local_3b8 = (assign_op<double,_double>)0xa;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_3b8,1);
        lVar14 = lVar14 + 8;
      } while (extraout_RDX_00 << 3 != lVar14);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_230,"TRI = []; QUAD = [];",0x14);
    local_3b8 = (assign_op<double,_double>)0xa;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,(char *)&local_3b8,1);
    iVar5 = (*mesh->_vptr_Mesh[2])(mesh,0);
    local_3e8 = CONCAT44(extraout_var_01,iVar5);
    local_430 = extraout_RDX_01;
    if (extraout_RDX_01 != 0) {
      local_430 = extraout_RDX_01 << 3;
      lVar14 = 0;
      local_3e0 = 0;
      do {
        plVar8 = *(long **)(local_3e8 + lVar14);
        (*mesh->_vptr_Mesh[5])(mesh,plVar8);
        puVar10 = (undefined8 *)(**(code **)(*plVar8 + 8))(plVar8,2);
        cVar4 = (**(code **)(*plVar8 + 0x20))(plVar8);
        if (cVar4 == '\x03') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"TRI(",4);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,",:) = [",7);
          (*mesh->_vptr_Mesh[5])(mesh,*puVar10);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          (*mesh->_vptr_Mesh[5])(mesh,puVar10[1]);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          (*mesh->_vptr_Mesh[5])(mesh,puVar10[2]);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ];",3);
          local_3b8 = (assign_op<double,_double>)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_3b8,1);
        }
        else {
          if (cVar4 != '\x04') {
            std::__cxx11::stringstream::stringstream((stringstream *)&local_3b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_3a8,"write_matlab can only handle triangles and quads",0x30);
            local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"false","");
            local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_428,
                       "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/io/write_matlab.cc"
                       ,"");
            std::__cxx11::stringbuf::str();
            lf::base::AssertionFailed(&local_450,&local_428,0x6b,&local_408);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_408._M_dataplus._M_p != &local_408.field_2) {
              operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_428._M_dataplus._M_p != &local_428.field_2) {
              operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_450._M_dataplus._M_p != &local_450.field_2) {
              operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1
                             );
            }
            prVar11 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar11,"this code should not be reached");
            __cxa_throw(prVar11,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_230,"QUAD(",5);
          local_3e0 = local_3e0 + 1;
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,",:) = [",7);
          (*mesh->_vptr_Mesh[5])(mesh,*puVar10);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          (*mesh->_vptr_Mesh[5])(mesh,puVar10[1]);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          (*mesh->_vptr_Mesh[5])(mesh,puVar10[2]);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          (*mesh->_vptr_Mesh[5])(mesh,puVar10[3]);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ];",3);
          local_3b8 = (assign_op<double,_double>)0xa;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_3b8,1);
        }
        lVar14 = lVar14 + 8;
      } while (local_430 != lVar14);
    }
  }
  local_230 = (undefined1  [8])_VTT;
  *(undefined8 *)(local_230 + *(long *)(_VTT + -0x18)) = __M_insert<void_const*>;
  std::filebuf::~filebuf((filebuf *)&local_228);
  std::ios_base::~ios_base(local_138);
  free(local_3d8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return;
}

Assistant:

void writeMatlab(const lf::mesh::Mesh& mesh, std::string filename) {
  using size_type = std::size_t;         // unsigned integer
  using dim_t = lf::base::RefEl::dim_t;  // type for dimensions
  const Eigen::MatrixXd zero(Eigen::MatrixXd::Zero(0, 1));

  // Preprocess filename: append .m, if not there already
  {
    const size_type fn_len = filename.size();
    if ((fn_len > 1) && (filename[fn_len - 2] != '.') &&
        (filename[fn_len - 1] != 'm')) {
      filename += ".m";
    }
  }
  // Open file for writing
  std::ofstream file(filename);
  if (file.is_open()) {
    // Start regular writing operations
    // Remove trailing .m
    filename.pop_back();
    filename.pop_back();
    file << "function [x,y,TRI,QUAD,EDS] = " << filename << "()" << '\n';
    file << "% Data for an unstructure planar hybrid 2D mesh" << '\n';

    // Obtain topological dimension of the mesh
    const dim_t dim_mesh = mesh.DimMesh();
    LF_VERIFY_MSG(dim_mesh == 2,
                  "write_matlab() only avvailable for 2D meshes");

    // Run through the nodes of the mesh and write x coordinates
    const dim_t node_codim(dim_mesh);
    // Number of nodes of the mesh
    const size_type no_of_nodes = mesh.NumEntities(node_codim);
    file << "x = zeros(" << no_of_nodes << ",1);" << '\n';
    file << "y = zeros(" << no_of_nodes << ",1);" << '\n';

    // Write node coordinates to file
    size_type node_cnt = 0;
    for (const mesh::Entity* node : mesh.Entities(node_codim)) {
      const lf::base::glb_idx_t node_index = mesh.Index(*node);
      const geometry::Geometry* geo_ptr = node->Geometry();
      Eigen::MatrixXd node_coord(geo_ptr->Global(zero));
      file << "x(" << node_index + 1 << ") = " << node_coord(0, 0) << "; "
           << '\n';
      file << "y(" << node_index + 1 << ") = " << node_coord(1, 0) << "; "
           << '\n';
      node_cnt++;
    }
    LF_VERIFY_MSG(node_cnt == no_of_nodes, "Node count mismatch");

    // Write edge information to file
    const size_type no_of_edges = mesh.NumEntities(1);
    file << "EDS = zeros(" << no_of_edges << ",2);" << '\n';
    size_type ed_cnt = 0;
    for (const mesh::Entity* edge : mesh.Entities(1)) {
      const lf::base::glb_idx_t edge_index = mesh.Index(*edge);
      const base::RefEl ref_el = edge->RefEl();
      LF_VERIFY_MSG(ref_el == lf::base::RefEl::kSegment(),
                    "Edge must be a segment");
      // Access endpoints = sub-entities of relative co-dimension 1
      const auto sub_ent = edge->SubEntities(1);
      file << "EDS(" << edge_index + 1 << ",:) = ["
           << mesh.Index(*sub_ent[0]) + 1 << ", " << mesh.Index(*sub_ent[1]) + 1
           << "];" << '\n';
      ed_cnt++;
    }

    // Write cell (entities of co-dimension 0) information to file
    file << "TRI = []; QUAD = [];" << '\n';
    size_type cell_cnt = 0;
    size_type triag_cnt = 0;
    size_type quad_cnt = 0;
    for (const mesh::Entity* e : mesh.Entities(0)) {
      const lf::base::glb_idx_t cell_index = mesh.Index(*e);
      // Access vertices =  sub-entities of relative co-dimension 2
      const auto sub_ent = e->SubEntities(2);
      const base::RefEl ref_el = e->RefEl();
      switch (ref_el) {
        case lf::base::RefEl::kTria(): {
          file << "TRI(" << triag_cnt + 1 << ",:) = ["
               << mesh.Index(*sub_ent[0]) + 1 << ", "
               << mesh.Index(*sub_ent[1]) + 1 << ", "
               << mesh.Index(*sub_ent[2]) + 1 << ", " << cell_index << " ];"
               << '\n';
          triag_cnt++;
          break;
        }
        case lf::base::RefEl::kQuad(): {
          file << "QUAD(" << quad_cnt + 1 << ",:) = ["
               << mesh.Index(*sub_ent[0]) + 1 << ", "
               << mesh.Index(*sub_ent[1]) + 1 << ", "
               << mesh.Index(*sub_ent[2]) + 1 << ", "
               << mesh.Index(*sub_ent[3]) + 1 << ", " << cell_index << " ];"
               << '\n';
          quad_cnt++;
          break;
        }
        default: {
          LF_VERIFY_MSG(false,
                        "write_matlab can only handle triangles and quads");
          break;
        }
      }
      cell_cnt++;
    }
  }
}